

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  pointer pfVar4;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x84,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  iVar5 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar5) {
    pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = Matrix::size(&this->super_Matrix,1);
    if ((long)pfVar1 - (long)pfVar2 >> 2 != iVar5) {
      __assert_fail("x.size() == this->size(1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                    ,0x86,
                    "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
    }
    lVar3 = (this->super_Matrix).n_;
    if (0 < lVar3) {
      lVar7 = (ulong)(uint)i * lVar3;
      pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar4 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        if ((ulong)((long)pfVar2 - (long)pfVar1 >> 2) <= (ulong)(lVar7 + lVar6)) {
          __assert_fail("i * n_ + j < data_.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.h"
                        ,0x30,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
        }
        pfVar4[lVar6] = pfVar1[lVar7 + lVar6] + pfVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar3 != lVar6);
    }
    return;
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x85,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += at(i, j);
  }
}